

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-access-set.hxx
# Opt level: O2

iterator __thiscall
andres::RandomAccessSet<int,_std::less<int>,_std::allocator<int>_>::find
          (RandomAccessSet<int,_std::less<int>,_std::allocator<int>_> *this,key_type *value)

{
  int *piVar1;
  iterator iVar2;
  
  iVar2 = lower_bound(this,value);
  piVar1 = (this->vector_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((iVar2._M_current != piVar1) && (*value < *iVar2._M_current)) {
    iVar2._M_current = piVar1;
  }
  return (iterator)iVar2._M_current;
}

Assistant:

inline typename RandomAccessSet<Key, Comparison, Allocator>::iterator
RandomAccessSet<Key, Comparison, Allocator>::find(
    const key_type& value
) {
    iterator i(lower_bound(value));
    if(i != end() && compare_(value, *i)) {
        i = end();
    }
    return i;
}